

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

void __thiscall
ear::StereoPannerDownmix::StereoPannerDownmix
          (StereoPannerDownmix *this,VectorXi *outputChannels,MatrixXd *positions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Layout layout;
  DenseStorage<int,__1,__1,_1,_0> local_140;
  string local_130;
  DenseStorage<double,__1,__1,__1,_0> local_110;
  Layout local_f8;
  Layout local_88;
  
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
            (&local_140,(DenseStorage<int,__1,__1,_1,_0> *)outputChannels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_110,(DenseStorage<double,__1,__1,__1,_0> *)positions);
  RegionHandler::RegionHandler
            (&this->super_RegionHandler,(VectorXi *)&local_140,(MatrixXd *)&local_110);
  free(local_110.m_data);
  free(local_140.m_data);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_00207b08;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"0+5+0","");
  getLayout(&local_f8,&local_130);
  Layout::withoutLfe(&local_88,&local_f8);
  if (local_f8._screen.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &local_f8._screen.super_type.m_storage);
    local_f8._screen.super_type.m_initialized = false;
  }
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_f8._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._name._M_dataplus._M_p != &local_f8._name.field_2) {
    operator_delete(local_f8._name._M_dataplus._M_p,local_f8._name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  configureFullPolarPanner(&local_f8);
  this_00 = (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8._name._M_dataplus._M_p;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._name._M_string_length;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((local_88._screen.super_type.m_initialized & 1U) != 0) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &local_88._screen.super_type.m_storage);
    local_88._screen.super_type.m_initialized = false;
  }
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_88._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._name._M_dataplus._M_p != &local_88._name.field_2) {
    operator_delete(local_88._name._M_dataplus._M_p,local_88._name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

StereoPannerDownmix::StereoPannerDownmix(Eigen::VectorXi outputChannels,
                                           Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    auto layout = getLayout("0+5+0").withoutLfe();
    _psp = configureFullPolarPanner(layout);
  }